

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void * worker_thread_get(void *arg)

{
  FILE *__stream;
  long lVar1;
  undefined8 uVar2;
  undefined8 local_138;
  size_t vsize;
  size_t vbufsize;
  char vbuf [256];
  ulong local_20;
  unsigned_long_long i;
  context *ctx;
  void *arg_local;
  
  vsize = 0x100;
  local_138 = 0;
  local_20 = 1;
  i = (unsigned_long_long)arg;
  ctx = (context *)arg;
  while( true ) {
    if (*(uint *)(i + 0x1c) <= local_20) {
      return (void *)0x0;
    }
    lVar1 = vmemcache_get(*(undefined8 *)(i + 8),&local_20,8,&vbufsize,vsize,0,&local_138);
    if (lVar1 == -1) break;
    local_20 = local_20 + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x88,"worker_thread_get");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_get: %s",uVar2);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void *
worker_thread_get(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	/* starting from 1, because the entry #0 has been evicted */
	for (i = 1; i < ctx->ops_count; i++) {
		if (vmemcache_get(ctx->cache, &i, sizeof(i),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}